

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O1

float __thiscall Vector3f::squaredLength(Vector3f *this)

{
  undefined1 auVar1 [16];
  
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(this->m_elements[1] * this->m_elements[1])),
                           ZEXT416((uint)this->m_elements[0]),ZEXT416((uint)this->m_elements[0]));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)this->m_elements[2]),ZEXT416((uint)this->m_elements[2]),
                           auVar1);
  return auVar1._0_4_;
}

Assistant:

float Vector3f::squaredLength() const
{
    return
        (
            m_elements[0] * m_elements[0] +
            m_elements[1] * m_elements[1] +
            m_elements[2] * m_elements[2]
        );
}